

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_> * __thiscall
spvtools::val::ValidationState_t::getSampledImageConsumers
          (vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
           *__return_storage_ptr__,ValidationState_t *this,uint32_t sampled_image_id)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>,_false>
  local_28;
  const_iterator iter;
  uint32_t sampled_image_id_local;
  ValidationState_t *this_local;
  vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_> *result;
  
  iter.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>,_false>
  ._M_cur._3_1_ = 0;
  iter.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>,_false>
  ._M_cur._4_4_ = sampled_image_id;
  std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>::vector
            (__return_storage_ptr__);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>_>_>
       ::find(&this->sampled_image_consumers_,
              (key_type *)
              ((long)&iter.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>,_false>
                      ._M_cur + 4));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>_>_>
       ::end(&this->sampled_image_consumers_);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>,_false,_false>
                           *)&local_28);
    std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>::
    operator=(__return_storage_ptr__,&pvVar2->second);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Instruction*> ValidationState_t::getSampledImageConsumers(
    uint32_t sampled_image_id) const {
  std::vector<Instruction*> result;
  auto iter = sampled_image_consumers_.find(sampled_image_id);
  if (iter != sampled_image_consumers_.end()) {
    result = iter->second;
  }
  return result;
}